

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O1

int amqp_time_from_now(amqp_time_t *time,timeval *timeout)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  timespec tp;
  timespec local_28;
  
  if (timeout == (timeval *)0x0) {
    time->time_point_ns = 0xffffffffffffffff;
    iVar3 = 0;
  }
  else {
    lVar1 = timeout->tv_sec;
    iVar3 = -10;
    if ((-1 < lVar1) && (lVar2 = timeout->tv_usec, -1 < lVar2)) {
      iVar3 = clock_gettime(1,&local_28);
      if (iVar3 == -1) {
        uVar4 = 0;
      }
      else {
        uVar4 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
      }
      if (uVar4 == 0) {
        iVar3 = -0xe;
      }
      else {
        uVar5 = lVar2 * 1000 + lVar1 * 1000000000;
        time->time_point_ns = uVar5 + uVar4;
        iVar3 = -10;
        if (!CARRY8(uVar5,uVar4)) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqp_time_from_now(amqp_time_t *time, const struct timeval *timeout) {
  uint64_t now_ns;
  uint64_t delta_ns;

  assert(NULL != time);

  if (NULL == timeout) {
    *time = amqp_time_infinite();
    return AMQP_STATUS_OK;
  }

  if (timeout->tv_sec < 0 || timeout->tv_usec < 0) {
    return AMQP_STATUS_INVALID_PARAMETER;
  }

  delta_ns = (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
             (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  time->time_point_ns = now_ns + delta_ns;
  if (now_ns > time->time_point_ns || delta_ns > time->time_point_ns) {
    return AMQP_STATUS_INVALID_PARAMETER;
  }

  return AMQP_STATUS_OK;
}